

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

void h2o_config_dispose_pathconf(h2o_pathconf_t *pathconf)

{
  h2o_handler_t **__ptr;
  st_h2o_handler_t *__ptr_00;
  h2o_filter_t **__ptr_01;
  st_h2o_filter_t *__ptr_02;
  h2o_logger_t **__ptr_03;
  st_h2o_logger_t *__ptr_04;
  size_t i;
  size_t sVar1;
  
  for (sVar1 = 0; __ptr = (pathconf->handlers).entries, sVar1 != (pathconf->handlers).size;
      sVar1 = sVar1 + 1) {
    __ptr_00 = __ptr[sVar1];
    if (__ptr_00->dispose != (_func_void_st_h2o_handler_t_ptr *)0x0) {
      (*__ptr_00->dispose)(__ptr_00);
    }
    free(__ptr_00);
  }
  free(__ptr);
  for (sVar1 = 0; __ptr_01 = (pathconf->filters).entries, sVar1 != (pathconf->filters).size;
      sVar1 = sVar1 + 1) {
    __ptr_02 = __ptr_01[sVar1];
    if (__ptr_02->dispose != (_func_void_st_h2o_filter_t_ptr *)0x0) {
      (*__ptr_02->dispose)(__ptr_02);
    }
    free(__ptr_02);
  }
  free(__ptr_01);
  for (sVar1 = 0; __ptr_03 = (pathconf->loggers).entries, sVar1 != (pathconf->loggers).size;
      sVar1 = sVar1 + 1) {
    __ptr_04 = __ptr_03[sVar1];
    if (__ptr_04->dispose != (_func_void_st_h2o_logger_t_ptr *)0x0) {
      (*__ptr_04->dispose)(__ptr_04);
    }
    free(__ptr_04);
  }
  free(__ptr_03);
  free((pathconf->path).base);
  if (pathconf->mimemap != (h2o_mimemap_t *)0x0) {
    h2o_mem_release_shared(pathconf->mimemap);
  }
  if (pathconf->env != (h2o_envconf_t *)0x0) {
    h2o_mem_release_shared(pathconf->env);
    return;
  }
  return;
}

Assistant:

void h2o_config_dispose_pathconf(h2o_pathconf_t *pathconf)
{
#define DESTROY_LIST(type, list)                                                                                                   \
    do {                                                                                                                           \
        size_t i;                                                                                                                  \
        for (i = 0; i != list.size; ++i) {                                                                                         \
            type *e = list.entries[i];                                                                                             \
            if (e->dispose != NULL)                                                                                                \
                e->dispose(e);                                                                                                     \
            free(e);                                                                                                               \
        }                                                                                                                          \
        free(list.entries);                                                                                                        \
    } while (0)
    DESTROY_LIST(h2o_handler_t, pathconf->handlers);
    DESTROY_LIST(h2o_filter_t, pathconf->filters);
    DESTROY_LIST(h2o_logger_t, pathconf->loggers);
#undef DESTROY_LIST

    free(pathconf->path.base);
    if (pathconf->mimemap != NULL)
        h2o_mem_release_shared(pathconf->mimemap);
    if (pathconf->env != NULL)
        h2o_mem_release_shared(pathconf->env);
}